

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortL.c
# Opt level: O1

void burstsortL(uchar **strings,size_t scnt)

{
  byte bVar1;
  byte *pbVar2;
  trierec *ptVar3;
  uint uVar4;
  void *__ptr;
  long lVar5;
  TRIE *node;
  trierec *ptVar6;
  uint uVar7;
  trierec *ptVar8;
  ulong uVar9;
  trierec *ptVar10;
  trierec *ptVar11;
  ulong uVar12;
  ulong uVar13;
  
  __ptr = calloc(scnt,0x10);
  if ((int)scnt != 0) {
    lVar5 = (scnt & 0xffffffff) << 3;
    do {
      *(undefined8 *)((long)__ptr + lVar5 * 2 + -0x10) = *(undefined8 *)((long)strings + lVar5 + -8)
      ;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  node = (TRIE *)calloc(1,0xc00);
  if (scnt != 0) {
    uVar12 = 0;
    do {
      pbVar2 = *(byte **)((long)__ptr + uVar12 * 0x10);
      uVar9 = (ulong)*pbVar2;
      uVar4 = node->counts[uVar9];
      ptVar11 = node;
      if ((int)uVar4 < 0) {
        uVar13 = 1;
        do {
          ptVar11 = ptVar11->ptrs[uVar9];
          uVar9 = (ulong)pbVar2[uVar13];
          uVar4 = ptVar11->counts[uVar9];
          uVar7 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar7;
        } while ((int)uVar4 < 0);
        uVar13 = (ulong)uVar7;
      }
      else {
        uVar13 = 1;
      }
      ptVar10 = (trierec *)(uVar12 * 0x10 + (long)__ptr);
      ptVar10->ptrs[1] = ptVar11->ptrs[uVar9];
      ptVar11->ptrs[uVar9] = ptVar10;
      if (((char)uVar9 != '\0') && (ptVar11->counts[uVar9] = uVar4 + 1, 0x1fff < uVar4)) {
        ptVar11->counts[uVar9] = -1;
        ptVar6 = (trierec *)calloc(1,0xc00);
        bVar1 = *(byte *)((long)ptVar10->ptrs[0]->ptrs + uVar13);
        ptVar3 = ptVar10->ptrs[1];
        while( true ) {
          ptVar8 = ptVar3;
          ptVar10->ptrs[1] = ptVar6->ptrs[bVar1];
          ptVar6->ptrs[bVar1] = ptVar10;
          ptVar6->counts[bVar1] = ptVar6->counts[bVar1] + 1;
          if (ptVar8 == (trierec *)0x0) break;
          bVar1 = *(byte *)((long)ptVar8->ptrs[0]->ptrs + uVar13);
          ptVar3 = ptVar8->ptrs[1];
          ptVar10 = ptVar8;
        }
        ptVar11->ptrs[uVar9] = ptVar6;
        ptVar11->counts[uVar9] = -1;
      }
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (uVar12 < scnt);
  }
  bursttraverseL(node,strings,0,0);
  free(__ptr);
  return;
}

Assistant:

void
burstsortL(unsigned char *strings[], size_t scnt)
{
    TRIE	*root;
    LIST	*listnodes;
    unsigned int i;

    listnodes = (LIST *) calloc(scnt, sizeof(LIST));

    for( i=scnt; i-- ;)
        listnodes[i].word = strings[i];

    root = (TRIE *) calloc(1, sizeof(TRIE));

    (void) burstinsertL(root, listnodes, scnt);

    (void) bursttraverseL(root, strings, 0, 0);

    free(listnodes);

    return;
}